

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzrot::ChNodeFEAxyzrot
          (ChNodeFEAxyzrot *this,void **vtt,ChNodeFEAxyzrot *other)

{
  _func_int **pp_Var1;
  ChLoadableUVW CVar2;
  ChVector<double> local_58;
  ChQuaternion<double> local_40;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase + (long)pp_Var1[-3]) = vtt[2];
  (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
  (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
  ChBodyFrame::ChBodyFrame
            ((ChBodyFrame *)&(this->super_ChNodeFEAbase).field_0x18,
             (ChBodyFrame *)&(other->super_ChNodeFEAbase).field_0x18);
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)&PTR__ChVariableTupleCarrier_1vars_01178ea8;
  CVar2 = *(ChLoadableUVW *)(vtt + 3);
  this->super_ChLoadableUVW = CVar2;
  *(void **)((long)(&(this->variables).inertia + -1) + *(long *)((long)CVar2 + -0x78)) = vtt[4];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase + (long)pp_Var1[-3]) = vtt[5];
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x18 = 0x1178808;
  (this->super_ChVariableTupleCarrier_1vars<6>)._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x228);
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 6);
  *(void **)((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
            (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-4]) = vtt[7];
  ChVariablesBodyOwnMass::ChVariablesBodyOwnMass(&this->variables);
  local_58.m_data[2] = 0.0;
  local_40.m_data[0] = 1.0;
  local_40.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->X0,&local_58,&local_40);
  (this->Force).m_data[2] = 0.0;
  (this->Torque).m_data[0] = 0.0;
  (this->Torque).m_data[1] = 0.0;
  (this->Torque).m_data[2] = 0.0;
  (this->Force).m_data[0] = 0.0;
  (this->Force).m_data[1] = 0.0;
  (this->Force).m_data[2] = 0.0;
  (this->Torque).m_data[0] = 0.0;
  ChFrame<double>::operator=(&this->X0,&other->X0);
  if (other != this) {
    (this->Force).m_data[0] = (other->Force).m_data[0];
    (this->Force).m_data[1] = (other->Force).m_data[1];
    (this->Force).m_data[2] = (other->Force).m_data[2];
    (this->Torque).m_data[0] = (other->Torque).m_data[0];
    (this->Torque).m_data[1] = (other->Torque).m_data[1];
    (this->Torque).m_data[2] = (other->Torque).m_data[2];
  }
  ChVariablesBodyOwnMass::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeFEAxyzrot::ChNodeFEAxyzrot(const ChNodeFEAxyzrot& other) : ChNodeFEAbase(other), ChBodyFrame(other) {
    X0 = other.X0;

    Force = other.Force;
    Torque = other.Torque;

    variables = other.variables;
}